

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O3

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::CheckType
          (UpgradeMemoryModel *this,uint32_t type_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  Op opcode;
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  pair<bool,_bool> pVar7;
  uint32_t uVar8;
  int32_t iVar9;
  Instruction *pIVar10;
  Instruction *index_inst;
  uint64_t uVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
  *puVar16;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pIVar10 = analysis::DefUseManager::GetDef
                      ((pIVar1->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,type_id);
  if (pIVar10->opcode_ != OpTypePointer) {
    __assert_fail("type_inst->opcode() == spv::Op::OpTypePointer",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                  ,0x19b,
                  "std::pair<bool, bool> spvtools::opt::UpgradeMemoryModel::CheckType(uint32_t, const std::vector<uint32_t> &)"
                 );
  }
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pDVar2 = (pIVar1->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar13 = (pIVar10->has_result_id_ & 1) + 1;
  if (pIVar10->has_type_id_ == false) {
    uVar13 = (uint)pIVar10->has_result_id_;
  }
  uVar8 = Instruction::GetSingleWordOperand(pIVar10,uVar13 + 1);
  pIVar10 = analysis::DefUseManager::GetDef(pDVar2,uVar8);
  uVar13 = (uint)((ulong)((long)(indices->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(indices->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar13 < 1) {
    bVar6 = false;
    bVar12 = false;
  }
  else {
    bVar6 = false;
    bVar12 = false;
    uVar15 = (ulong)(uVar13 & 0x7fffffff);
    do {
      uVar14 = uVar15 - 1;
      if (((bool)bVar6 != false) && ((bool)bVar12 != false)) break;
      opcode = pIVar10->opcode_;
      if (opcode == OpTypeStruct) {
        puVar3 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar14)
        {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar14);
        }
        uVar8 = puVar3[uVar14];
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar1);
        }
        index_inst = analysis::DefUseManager::GetDef
                               ((pIVar1->def_use_mgr_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                ._M_head_impl,uVar8);
        if (index_inst->opcode_ != OpConstant) {
          __assert_fail("index_inst->opcode() == spv::Op::OpConstant",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                        ,0x1a7,
                        "std::pair<bool, bool> spvtools::opt::UpgradeMemoryModel::CheckType(uint32_t, const std::vector<uint32_t> &)"
                       );
        }
        uVar11 = GetIndexValue(this,index_inst);
        uVar8 = (uint32_t)uVar11;
        bVar4 = HasDecoration(this,pIVar10,uVar8,Coherent);
        bVar5 = HasDecoration(this,pIVar10,uVar8,DecorationVolatile);
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar1);
        }
        bVar6 = bVar6 | bVar4;
        bVar12 = bVar12 | bVar5;
        puVar16 = &pIVar1->def_use_mgr_;
        uVar13 = (pIVar10->has_result_id_ & 1) + 1;
        if (pIVar10->has_type_id_ == false) {
          uVar13 = (uint)pIVar10->has_result_id_;
        }
        uVar8 = uVar13 + uVar8;
      }
      else if (opcode == OpTypePointer) {
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar1);
        }
        puVar16 = &pIVar1->def_use_mgr_;
        uVar13 = (pIVar10->has_result_id_ & 1) + 1;
        if (pIVar10->has_type_id_ == false) {
          uVar13 = (uint)pIVar10->has_result_id_;
        }
        uVar8 = uVar13 + 1;
      }
      else {
        iVar9 = spvOpcodeIsComposite(opcode);
        if (iVar9 == 0) {
          __assert_fail("spvOpcodeIsComposite(element_inst->opcode())",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                        ,0x1b0,
                        "std::pair<bool, bool> spvtools::opt::UpgradeMemoryModel::CheckType(uint32_t, const std::vector<uint32_t> &)"
                       );
        }
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar1);
        }
        puVar16 = &pIVar1->def_use_mgr_;
        uVar8 = (pIVar10->has_result_id_ & 1) + 1;
        if (pIVar10->has_type_id_ == false) {
          uVar8 = (uint)pIVar10->has_result_id_;
        }
      }
      pDVar2 = (puVar16->_M_t).
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
      uVar8 = Instruction::GetSingleWordOperand(pIVar10,uVar8);
      pIVar10 = analysis::DefUseManager::GetDef(pDVar2,uVar8);
      bVar4 = 1 < uVar15;
      uVar15 = uVar14;
    } while (bVar4);
    if (((bool)bVar6 != false) && ((bool)bVar12 != false)) goto LAB_00514efd;
  }
  pVar7 = CheckAllTypes(this,pIVar10);
  bVar6 = pVar7.first | bVar6;
  bVar12 = pVar7.second | bVar12;
LAB_00514efd:
  pVar7.second = (bool)bVar12;
  pVar7.first = (bool)bVar6;
  return pVar7;
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::CheckType(
    uint32_t type_id, const std::vector<uint32_t>& indices) {
  bool is_coherent = false;
  bool is_volatile = false;
  Instruction* type_inst = context()->get_def_use_mgr()->GetDef(type_id);
  assert(type_inst->opcode() == spv::Op::OpTypePointer);
  Instruction* element_inst = context()->get_def_use_mgr()->GetDef(
      type_inst->GetSingleWordInOperand(1u));
  for (int i = (int)indices.size() - 1; i >= 0; --i) {
    if (is_coherent && is_volatile) break;

    if (element_inst->opcode() == spv::Op::OpTypePointer) {
      element_inst = context()->get_def_use_mgr()->GetDef(
          element_inst->GetSingleWordInOperand(1u));
    } else if (element_inst->opcode() == spv::Op::OpTypeStruct) {
      uint32_t index = indices.at(i);
      Instruction* index_inst = context()->get_def_use_mgr()->GetDef(index);
      assert(index_inst->opcode() == spv::Op::OpConstant);
      uint64_t value = GetIndexValue(index_inst);
      is_coherent |= HasDecoration(element_inst, static_cast<uint32_t>(value),
                                   spv::Decoration::Coherent);
      is_volatile |= HasDecoration(element_inst, static_cast<uint32_t>(value),
                                   spv::Decoration::Volatile);
      element_inst = context()->get_def_use_mgr()->GetDef(
          element_inst->GetSingleWordInOperand(static_cast<uint32_t>(value)));
    } else {
      assert(spvOpcodeIsComposite(element_inst->opcode()));
      element_inst = context()->get_def_use_mgr()->GetDef(
          element_inst->GetSingleWordInOperand(0u));
    }
  }

  if (!is_coherent || !is_volatile) {
    bool remaining_coherent = false;
    bool remaining_volatile = false;
    std::tie(remaining_coherent, remaining_volatile) =
        CheckAllTypes(element_inst);
    is_coherent |= remaining_coherent;
    is_volatile |= remaining_volatile;
  }

  return std::make_pair(is_coherent, is_volatile);
}